

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

void __thiscall nuraft::buffer::put(buffer *this,int32 val)

{
  uint uVar1;
  buffer *pbVar2;
  overflow_error *this_00;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = uVar1 & 0x7fffffff;
  }
  else {
    uVar3 = (uint)*(ushort *)this;
  }
  if ((int)uVar1 < 0) {
    uVar5 = *(uint *)(this + 4);
  }
  else {
    uVar5 = (uint)*(ushort *)(this + 2);
  }
  if (3 < (ulong)uVar3 - (ulong)uVar5) {
    if ((int)uVar1 < 0) {
      lVar4 = (ulong)*(uint *)(this + 4) + 8;
    }
    else {
      lVar4 = (ulong)*(ushort *)(this + 2) + 4;
    }
    pbVar2 = this + lVar4;
    lVar4 = 0;
    do {
      *pbVar2 = SUB41(val >> ((byte)lVar4 & 0x1f),0);
      lVar4 = lVar4 + 8;
      pbVar2 = pbVar2 + 1;
    } while (lVar4 != 0x20);
    if (*(int *)this < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 4;
    }
    else {
      *(short *)(this + 2) = *(short *)(this + 2) + 4;
    }
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"insufficient buffer to store int32");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

size_t buffer::size() const {
    return (size_t)( __size_of_block(this) );
}